

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O0

void run_xor_test(void)

{
  int iVar1;
  int iVar2;
  array_container_t *paVar3;
  bitset_container_t *pbVar4;
  bitset_container_t *bitset;
  bitset_container_t *bitset_00;
  bitset_container_t *bitset_01;
  run_container_t *src_1;
  run_container_t *src_1_00;
  container_t **dst;
  unsigned_long b;
  int card_3_4;
  int i;
  array_container_t *A_small;
  container_t *C;
  int cx12;
  int x_4;
  int randstate;
  int x_3;
  int x_2;
  int x_1;
  int x;
  run_container_t *R4;
  run_container_t *R3;
  run_container_t *R2;
  run_container_t *R1;
  bitset_container_t *BX;
  bitset_container_t *B3;
  bitset_container_t *B2;
  bitset_container_t *B1;
  array_container_t *AX;
  array_container_t *A3;
  array_container_t *A2;
  array_container_t *A1;
  run_container_t *in_stack_ffffffffffffff38;
  array_container_t *in_stack_ffffffffffffff40;
  run_container_t *in_stack_ffffffffffffff48;
  run_container_t *in_stack_ffffffffffffff50;
  run_container_t *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar5;
  run_container_t *in_stack_ffffffffffffff70;
  array_container_t *src_1_01;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  
  array_container_create();
  array_container_create();
  array_container_create();
  paVar3 = array_container_create();
  pbVar4 = bitset_container_create();
  bitset = bitset_container_create();
  bitset_00 = bitset_container_create();
  bitset_01 = bitset_container_create();
  run_container_create();
  run_container_create();
  run_container_create();
  run_container_create();
  for (local_64 = 0; local_64 < 0x10000; local_64 = local_64 + 1) {
    if (local_64 % 5 < 3) {
      array_container_add(in_stack_ffffffffffffff40,
                          (uint16_t)((ulong)in_stack_ffffffffffffff38 >> 0x30));
      bitset_container_set(pbVar4,(uint16_t)local_64);
      run_container_add(in_stack_ffffffffffffff48,
                        (uint16_t)((ulong)in_stack_ffffffffffffff40 >> 0x30));
    }
  }
  for (local_68 = 0; local_68 < 0x10000; local_68 = local_68 + 1) {
    if (local_68 % 0x3e < 0x25) {
      array_container_add(in_stack_ffffffffffffff40,
                          (uint16_t)((ulong)in_stack_ffffffffffffff38 >> 0x30));
      bitset_container_set(bitset,(uint16_t)local_68);
      run_container_add(in_stack_ffffffffffffff48,
                        (uint16_t)((ulong)in_stack_ffffffffffffff40 >> 0x30));
    }
  }
  for (local_6c = 0; local_6c < 0x10000; local_6c = local_6c + 1) {
    if (local_6c % 0x3e < 0x25 != local_6c % 5 < 3) {
      array_container_add(in_stack_ffffffffffffff40,
                          (uint16_t)((ulong)in_stack_ffffffffffffff38 >> 0x30));
      bitset_container_set(bitset_01,(uint16_t)local_6c);
    }
  }
  for (local_70 = 0; local_70 < 0x10000; local_70 = local_70 + 1) {
    if ((local_70 % 5 < 2) || ((local_70 % 5 < 3 && (10000 < local_70)))) {
      array_container_add(in_stack_ffffffffffffff40,
                          (uint16_t)((ulong)in_stack_ffffffffffffff38 >> 0x30));
      bitset_container_set(bitset_00,(uint16_t)local_70);
      run_container_add(in_stack_ffffffffffffff48,
                        (uint16_t)((ulong)in_stack_ffffffffffffff40 >> 0x30));
    }
  }
  local_74 = 1;
  for (local_78 = 0; local_78 < 0x10000; local_78 = local_78 + 1) {
    if (local_74 % 4 != 0) {
      run_container_add(in_stack_ffffffffffffff48,
                        (uint16_t)((ulong)in_stack_ffffffffffffff40 >> 0x30));
    }
    local_74 = (local_74 * 0xd68 + 0x1a85) % 0x26f5;
  }
  iVar1 = array_container_cardinality(paVar3);
  paVar3 = (array_container_t *)0x0;
  run_bitset_container_xor
            (in_stack_ffffffffffffff58,(bitset_container_t *)in_stack_ffffffffffffff50,
             (container_t **)in_stack_ffffffffffffff48);
  _assert_true((unsigned_long)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
               (char *)in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  array_container_cardinality(paVar3);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff50,
                    (unsigned_long)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  array_container_free((array_container_t *)0x1047e4);
  paVar3 = (array_container_t *)0x0;
  array_run_container_xor
            ((array_container_t *)0x0,in_stack_ffffffffffffff70,
             (container_t **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff50,
                    (unsigned_long)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  array_container_cardinality(paVar3);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff50,
                    (unsigned_long)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  array_container_free((array_container_t *)0x10484c);
  run_run_container_xor
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (container_t **)in_stack_ffffffffffffff40);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff50,
                    (unsigned_long)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  run_container_cardinality(in_stack_ffffffffffffff38);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff50,
                    (unsigned_long)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  run_container_free((run_container_t *)0x1048b4);
  paVar3 = (array_container_t *)0x0;
  run_bitset_container_xor
            (in_stack_ffffffffffffff58,(bitset_container_t *)in_stack_ffffffffffffff50,
             (container_t **)in_stack_ffffffffffffff48);
  _assert_true((unsigned_long)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
               (char *)in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  array_container_cardinality(paVar3);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff50,
                    (unsigned_long)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  array_container_free((array_container_t *)0x104926);
  paVar3 = (array_container_t *)0x0;
  array_run_container_xor
            ((array_container_t *)0x0,in_stack_ffffffffffffff70,
             (container_t **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff50,
                    (unsigned_long)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  array_container_cardinality(paVar3);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff50,
                    (unsigned_long)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  array_container_free((array_container_t *)0x10498f);
  paVar3 = (array_container_t *)0x0;
  run_run_container_xor
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (container_t **)in_stack_ffffffffffffff40);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff50,
                    (unsigned_long)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  array_container_cardinality(paVar3);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff50,
                    (unsigned_long)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  array_container_free((array_container_t *)0x1049f5);
  pbVar4 = (bitset_container_t *)0x0;
  run_bitset_container_xor
            (in_stack_ffffffffffffff58,(bitset_container_t *)in_stack_ffffffffffffff50,
             (container_t **)in_stack_ffffffffffffff48);
  _assert_true((unsigned_long)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
               (char *)in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  src_1 = (run_container_t *)(long)iVar1;
  bitset_container_cardinality(pbVar4);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)in_stack_ffffffffffffff48,
                    (char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  bitset_container_free((bitset_container_t *)0x104a6e);
  pbVar4 = (bitset_container_t *)0x0;
  array_run_container_xor
            ((array_container_t *)0x0,in_stack_ffffffffffffff70,
             (container_t **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)in_stack_ffffffffffffff48,
                    (char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  src_1_00 = (run_container_t *)(long)iVar1;
  bitset_container_cardinality(pbVar4);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)in_stack_ffffffffffffff48,
                    (char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  bitset_container_free((bitset_container_t *)0x104ae1);
  src_1_01 = (array_container_t *)0x0;
  paVar3 = array_container_create();
  for (iVar5 = 1000; iVar5 < 0x3f2; iVar5 = iVar5 + 1) {
    array_container_add(in_stack_ffffffffffffff40,
                        (uint16_t)((ulong)in_stack_ffffffffffffff38 >> 0x30));
  }
  array_run_container_xor
            (src_1_01,(run_container_t *)paVar3,
             (container_t **)CONCAT44(iVar5,in_stack_ffffffffffffff68));
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)in_stack_ffffffffffffff48,
                    (char *)in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  run_container_cardinality(in_stack_ffffffffffffff38);
  iVar2 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)in_stack_ffffffffffffff48,
                    (char *)in_stack_ffffffffffffff40,iVar2);
  run_container_free((run_container_t *)0x104b7e);
  pbVar4 = (bitset_container_t *)0x0;
  run_run_container_xor(src_1,in_stack_ffffffffffffff48,(container_t **)in_stack_ffffffffffffff40);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)in_stack_ffffffffffffff48,
                    (char *)in_stack_ffffffffffffff40,iVar2);
  iVar1 = iVar1 >> 0x1f;
  bitset_container_cardinality(pbVar4);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)in_stack_ffffffffffffff48,
                    (char *)in_stack_ffffffffffffff40,iVar1);
  bitset_container_free((bitset_container_t *)0x104bec);
  pbVar4 = (bitset_container_t *)0x0;
  run_bitset_container_xor
            (src_1_00,(bitset_container_t *)src_1,(container_t **)in_stack_ffffffffffffff48);
  _assert_true((unsigned_long)src_1,(char *)in_stack_ffffffffffffff48,
               (char *)in_stack_ffffffffffffff40,iVar1);
  iVar2 = bitset_container_cardinality(pbVar4);
  bitset_container_free((bitset_container_t *)0x104c43);
  pbVar4 = (bitset_container_t *)0x0;
  array_run_container_xor
            ((array_container_t *)0x0,(run_container_t *)paVar3,
             (container_t **)CONCAT44(iVar5,iVar2));
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)in_stack_ffffffffffffff48,
                    (char *)in_stack_ffffffffffffff40,iVar1);
  dst = (container_t **)(long)iVar2;
  bitset_container_cardinality(pbVar4);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)in_stack_ffffffffffffff48,(char *)dst,iVar1)
  ;
  bitset_container_free((bitset_container_t *)0x104cb3);
  pbVar4 = (bitset_container_t *)0x0;
  run_run_container_xor(src_1,in_stack_ffffffffffffff48,dst);
  _assert_int_equal((unsigned_long)src_1,(unsigned_long)in_stack_ffffffffffffff48,(char *)dst,iVar1)
  ;
  b = (unsigned_long)iVar2;
  bitset_container_cardinality(pbVar4);
  _assert_int_equal((unsigned_long)src_1,b,(char *)dst,iVar1);
  bitset_container_free((bitset_container_t *)0x104d20);
  array_container_free((array_container_t *)0x104d36);
  array_container_free((array_container_t *)0x104d43);
  array_container_free((array_container_t *)0x104d50);
  array_container_free((array_container_t *)0x104d5d);
  array_container_free((array_container_t *)0x104d67);
  bitset_container_free((bitset_container_t *)0x104d74);
  bitset_container_free((bitset_container_t *)0x104d81);
  bitset_container_free((bitset_container_t *)0x104d8e);
  bitset_container_free((bitset_container_t *)0x104d9b);
  run_container_free((run_container_t *)0x104da8);
  run_container_free((run_container_t *)0x104db2);
  run_container_free((run_container_t *)0x104dbc);
  run_container_free((run_container_t *)0x104dc6);
  return;
}

Assistant:

DEFINE_TEST(run_xor_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* A3 = array_container_create();
    array_container_t* AX = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* B3 = bitset_container_create();
    bitset_container_t* BX = bitset_container_create();
    run_container_t* R1 = run_container_create();
    run_container_t* R2 = run_container_create();
    run_container_t* R3 = run_container_create();
    run_container_t* R4 = run_container_create();

    // B/A1 xor R1 is empty (array or run, I guess)
    // B/A1 xor R2 is probably best left as runs
    // B/A3 xor R1 is best as an array.
    // B/A3 xor R4 is best as a bitmap

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x++) {
        if (x % 5 < 3) {
            array_container_add(A1, x);
            bitset_container_set(B1, x);
            run_container_add(R1, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 62 < 37) {
            array_container_add(A2, x);
            bitset_container_set(B2, x);
            run_container_add(R2, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 62 < 37) ^ (x % 5 < 3)) {
            array_container_add(AX, x);
            bitset_container_set(BX, x);
        }

    // the elements x%5 == 2 differ for less than 10k, otherwise same)
    for (int x = 0; x < (1 << 16); x++) {
        if ((x % 5 < 2) || ((x % 5 < 3) && (x > 10000))) {
            array_container_add(A3, x);
            bitset_container_set(B3, x);
            run_container_add(R3, x);
        }
    }

    int randstate = 1;  // for Oakenfull RNG, hope LSBits are nice
    for (int x = 0; x < (1 << 16); x++) {
        if (randstate % 4) {
            run_container_add(R4, x);
        }
        randstate = (3432 * randstate + 6789) % 9973;
    }

    int cx12 = array_container_cardinality(AX);  // expected xor for ?1 and ?2

    container_t* C = NULL;

    assert_false(run_bitset_container_xor(R1, B1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE, array_run_container_xor(A1, R1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    // both run coding and array coding have same serialized size for
    // empty
    assert_int_equal(RUN_CONTAINER_TYPE, run_run_container_xor(R1, R1, &C));
    assert_int_equal(0, run_container_cardinality(CAST_run(C)));
    run_container_free(CAST_run(C));
    C = NULL;

    assert_false(run_bitset_container_xor(R1, B3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE, array_run_container_xor(A3, R1, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE, run_run_container_xor(R1, R3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_true(run_bitset_container_xor(R1, B2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_xor(A2, R1, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    array_container_t* A_small = array_container_create();
    for (int i = 1000; i < 1010; ++i) array_container_add(A_small, i);

    assert_int_equal(RUN_CONTAINER_TYPE,
                     array_run_container_xor(A_small, R2, &C));
    assert_int_equal(0x98bd, run_container_cardinality(CAST_run(C)));
    run_container_free(CAST_run(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE, run_run_container_xor(R1, R2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_true(run_bitset_container_xor(R4, B3, &C));
    int card_3_4 = bitset_container_cardinality(CAST_bitset(C));
    // assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_xor(A3, R4, &C));
    // if this fails, either this bitset is wrong or the previous one...
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE, run_run_container_xor(R4, R3, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    array_container_free(A1);
    array_container_free(A2);
    array_container_free(A3);
    array_container_free(AX);
    array_container_free(A_small);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(B3);
    bitset_container_free(BX);

    run_container_free(R1);
    run_container_free(R2);
    run_container_free(R3);
    run_container_free(R4);
}